

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcAnalyzer.cpp
# Opt level: O1

void __thiscall HdlcAnalyzer::ProcessControlField(HdlcAnalyzer *this)

{
  HdlcControlType HVar1;
  bool bVar2;
  HdlcAnalyzer *pHVar3;
  U64 UVar4;
  U64 UVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  byte bVar9;
  Frame frame_1;
  HdlcByte byte;
  HdlcByte byte0;
  Frame frame0;
  HdlcByte local_c0;
  ulong local_a8;
  undefined1 local_a0;
  undefined1 local_9f;
  HdlcAnalyzer *local_98;
  ulong local_90;
  HdlcByte local_88;
  HdlcByte local_70;
  U64 local_58;
  U64 UStack_50;
  ulong local_48;
  undefined8 local_40;
  undefined1 local_38;
  undefined1 local_37;
  
  if (this->mAbortFrame != false) {
    return;
  }
  if (((this->mSettings)._M_ptr)->mHdlcControl == HDLC_BASIC_CONTROL_FIELD) {
    ReadByte(&local_c0,this);
    UStack_50 = local_c0.endSample;
    local_58 = local_c0.startSample;
    if (this->mAbortFrame != false) {
      return;
    }
    bVar2 = local_c0.escaped;
    uVar8 = local_c0._16_8_ & 0xff;
    Frame::Frame((Frame *)&local_58);
    local_38 = 3;
    local_40 = 0;
    local_37 = bVar2;
    local_48 = uVar8;
    std::vector<Frame,_std::allocator<Frame>_>::push_back(&this->mResultFrames,(Frame *)&local_58);
    this->mCurrentFrameIsSFrame = (local_c0.value & 3) == 1;
    goto LAB_001086af;
  }
  ReadByte(&local_70,this);
  if (this->mAbortFrame != false) {
    return;
  }
  Frame::Frame((Frame *)&local_58);
  local_58 = local_70.startSample;
  UStack_50 = local_70.endSample;
  local_38 = 4;
  local_40 = 0;
  local_37 = local_70.escaped;
  local_48 = (ulong)local_70.value;
  std::vector<Frame,_std::allocator<Frame>_>::push_back(&this->mResultFrames,(Frame *)&local_58);
  bVar9 = (local_70.value & 2) + 1 & -(local_70.value & 1);
  this->mCurrentFrameIsSFrame = bVar9 == 1;
  if (bVar9 == 3) goto LAB_001086af;
  HVar1 = ((this->mSettings)._M_ptr)->mHdlcControl;
  if (HVar1 == HDLC_EXTENDED_CONTROL_FIELD_MOD_128) {
    uVar6 = 2;
LAB_00108616:
    bVar2 = true;
  }
  else {
    if (HVar1 == HDLC_EXTENDED_CONTROL_FIELD_MOD_32768) {
      uVar6 = 4;
      goto LAB_00108616;
    }
    bVar2 = false;
    uVar6 = 0;
    if (HVar1 == HDLC_EXTENDED_CONTROL_FIELD_MOD_2147483648) {
      uVar6 = 8;
      goto LAB_00108616;
    }
  }
  if (bVar2) {
    local_90 = 2;
    if (2 < uVar6) {
      local_90 = (ulong)uVar6;
    }
    uVar8 = 1;
    local_98 = this;
    do {
      pHVar3 = local_98;
      ReadByte(&local_88,local_98);
      bVar2 = local_88.escaped;
      UVar5 = local_88.endSample;
      UVar4 = local_88.startSample;
      if (pHVar3->mAbortFrame != false) break;
      uVar7 = (ulong)local_88.value;
      Frame::Frame((Frame *)&local_c0);
      local_c0.startSample = UVar4;
      local_c0.endSample = UVar5;
      local_a0 = 4;
      local_9f = bVar2;
      local_c0._16_8_ = uVar7;
      local_a8 = uVar8;
      std::vector<Frame,_std::allocator<Frame>_>::push_back
                (&this->mResultFrames,(value_type *)&local_c0);
      Frame::~Frame((Frame *)&local_c0);
      uVar8 = uVar8 + 1;
    } while (local_90 != uVar8);
  }
LAB_001086af:
  Frame::~Frame((Frame *)&local_58);
  return;
}

Assistant:

void HdlcAnalyzer::ProcessControlField()
{
    if( mAbortFrame )
    {
        return;
    }

    if( mSettings->mHdlcControl == HDLC_BASIC_CONTROL_FIELD ) // Basic Control Field of 1 byte
    {
        HdlcByte controlByte = ReadByte();
        if( mAbortFrame )
        {
            return;
        }

        U8 flag = ( controlByte.escaped ) ? HDLC_ESCAPED_BYTE : 0;
        Frame frame = CreateFrame( HDLC_FIELD_BASIC_CONTROL, controlByte.startSample, controlByte.endSample, controlByte.value, 0, flag );
        AddFrameToResults( frame );

        HdlcFrameType frameType = GetFrameType( controlByte.value );
        mCurrentFrameIsSFrame = ( frameType == HDLC_S_FRAME );
    }
    else // Extended Control Field
    {
        // Read first byte and check type of frame
        HdlcByte byte0 = ReadByte();
        if( mAbortFrame )
        {
            return;
        }
        HdlcFrameType frameType = GetFrameType( byte0.value );
        U8 flag = ( byte0.escaped ) ? HDLC_ESCAPED_BYTE : 0;

        Frame frame0 = CreateFrame( HDLC_FIELD_EXTENDED_CONTROL, byte0.startSample, byte0.endSample, byte0.value, 0, flag );
        AddFrameToResults( frame0 );

        mCurrentFrameIsSFrame = ( frameType == HDLC_S_FRAME );

        if( frameType != HDLC_U_FRAME )
        {
            U32 ctlBytes = 0;
            switch( mSettings->mHdlcControl )
            {
            case HDLC_EXTENDED_CONTROL_FIELD_MOD_128:
                ctlBytes = 2;
                break;
            case HDLC_EXTENDED_CONTROL_FIELD_MOD_32768:
                ctlBytes = 4;
                break;
            case HDLC_EXTENDED_CONTROL_FIELD_MOD_2147483648:
                ctlBytes = 8;
                break;
            }
            for( U32 i = 1; i < ctlBytes; ++i )
            {
                HdlcByte byte = ReadByte();
                if( mAbortFrame )
                {
                    return;
                }
                U8 flag = ( byte.escaped ) ? HDLC_ESCAPED_BYTE : 0;
                Frame frame = CreateFrame( HDLC_FIELD_EXTENDED_CONTROL, byte.startSample, byte.endSample, byte.value, i, flag );
                AddFrameToResults( frame );
            }
        }
    }
}